

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O3

c_v256 * c_v256_unpackhi_u16_s32(c_v256 a)

{
  c_v256 *in_RDI;
  
  in_RDI->u64[2] = (ulong)(a.u32[6] & 0xffff0000) << 0x10 | a.u64[3] & 0xffff;
  in_RDI->u64[3] = a.u64[3] >> 0x10 & 0xffff00000000 | a.u64[3] >> 0x20 & 0xffff;
  in_RDI->u64[0] = (ulong)(a.u32[4] & 0xffff0000) << 0x10 | a.u64[2] & 0xffff;
  in_RDI->u64[1] = a.u64[2] >> 0x10 & 0xffff00000000 | a.u64[2] >> 0x20 & 0xffff;
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_unpackhi_u16_s32(c_v256 a) {
  return c_v256_from_v128(c_v128_unpackhi_u16_s32(a.v128[1]),
                          c_v128_unpacklo_u16_s32(a.v128[1]));
}